

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  JavaType JVar4;
  int iVar5;
  Descriptor *type;
  string *psVar6;
  FieldDescriptor *field_00;
  uint uVar7;
  uint uVar8;
  _func_void_FieldDescriptor_ptr *local_50 [2];
  undefined1 local_40 [16];
  FieldDescriptor *local_30;
  
  iVar5 = *(int *)(field + 0x3c);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_50[0] = google::protobuf::FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_50,&local_30);
  }
  uVar7 = (uint)(iVar5 == 2) * 0x100;
  uVar8 = uVar7;
  if (*(int *)(field + 0x38) == 9) {
    if (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) {
      uVar8 = uVar7 | 0x200;
    }
    else {
      uVar8 = uVar7 + 0x200;
      if (*(char *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0x9a) == '\0') {
        uVar8 = uVar7;
      }
    }
  }
  if (*(int *)(field + 0x3c) != 2) {
    JVar4 = GetJavaType(field);
    if (JVar4 != JAVATYPE_MESSAGE) goto LAB_00215e02;
    type = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    bVar2 = HasRequiredFields(type);
    if (!bVar2) goto LAB_00215e02;
  }
  uVar8 = uVar8 | 0x400;
LAB_00215e02:
  uVar7 = uVar8;
  if (*(int *)(field + 0x3c) != 3) {
    if ((field[0x41] == (FieldDescriptor)0x0) &&
       ((*(int *)(field + 0x3c) != 1 || (*(int *)(*(long *)(field + 0x28) + 0x3c) != 2)))) {
      uVar7 = uVar8 + 0x1000;
      if (*(int *)(*(long *)(field + 0x28) + 0x3c) != 2) {
        uVar7 = uVar8;
      }
    }
    else {
      uVar7 = uVar8 | 0x1000;
    }
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_50[0] = google::protobuf::FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_50,&local_30);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (cVar3 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar3 != '\0')) {
    uVar8 = uVar7;
    if (*(int *)(*(long *)(field + 0x28) + 0x3c) != 3) {
      psVar6 = (string *)google::protobuf::FieldDescriptor::message_type();
      local_50[0] = (_func_void_FieldDescriptor_ptr *)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"value","");
      field_00 = (FieldDescriptor *)google::protobuf::Descriptor::FindFieldByName(psVar6);
      if (local_50[0] != (_func_void_FieldDescriptor_ptr *)local_40) {
        operator_delete(local_50[0]);
      }
      JVar4 = GetJavaType(field_00);
      uVar8 = uVar7 | 0x800;
      if (JVar4 != JAVATYPE_ENUM) {
        uVar8 = uVar7;
      }
    }
    uVar8 = uVar8 | 0x32;
  }
  else {
    cVar3 = google::protobuf::FieldDescriptor::is_packed();
    if (cVar3 == '\0') {
      if (*(int *)(field + 0x3c) == 3) {
        uVar8 = GetExperimentalJavaFieldTypeForRepeated(field);
      }
      else {
        lVar1 = *(long *)(field + 0x58);
        if ((lVar1 == 0) ||
           ((*(int *)(lVar1 + 0x18) == 1 && (*(char *)(**(long **)(lVar1 + 0x20) + 0x41) != '\0'))))
        {
          uVar8 = GetExperimentalJavaFieldTypeForSingular(field);
        }
        else {
          iVar5 = GetExperimentalJavaFieldTypeForSingular(field);
          uVar8 = iVar5 + 0x33;
        }
      }
      uVar8 = uVar8 | uVar7;
    }
    else {
      uVar8 = GetExperimentalJavaFieldTypeForPacked(field);
    }
  }
  return uVar8;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;
  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kMapWithProto2EnumValue = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(field)) {
      const FieldDescriptor* value =
          field->message_type()->FindFieldByName("value");
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kMapWithProto2EnumValue;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field);
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}